

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O0

boolean restrap(monst *mtmp)

{
  boolean bVar1;
  int iVar2;
  obj *poVar3;
  monst *mtmp_local;
  
  if ((((((*(uint *)&mtmp->field_0x60 >> 4 & 7) != 0) ||
        ((*(uint *)&mtmp->field_0x60 >> 8 & 1) != 0)) || (mtmp->m_ap_type != '\0')) ||
      ((((viz_array[mtmp->my][mtmp->mx] & 2U) != 0 || (iVar2 = rn2(3), iVar2 != 0)) ||
       (mtmp == u.ustuck)))) ||
     ((((((mtmp->data->mflags1 & 0x10000) == 0 &&
         ((poVar3 = which_armor(mtmp,4), poVar3 == (obj *)0x0 ||
          (poVar3 = which_armor(mtmp,4), poVar3->otyp != 0x4f)))) &&
        ((((u.uprops[0x1e].intrinsic != 0 ||
           (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
            (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
          (((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) &&
           (((((u.uprops[0x19].intrinsic != 0 ||
               ((u.uprops[0x19].extrinsic != 0 || (youmonst.data == mons + 0x1e)))) ||
              (youmonst.data == mons + 0x31)) || (youmonst.data == mons + 0x32)) &&
            (u.uprops[0x19].blocked == 0)))))) ||
         (((u.uprops[0x19].extrinsic != 0 && (u.uprops[0x19].blocked == 0)) &&
          (iVar2 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar2 < 0x41)))))) ||
       (((u.uprops[0x42].intrinsic != 0 || (u.uprops[0x42].extrinsic != 0)) ||
        (bVar1 = match_warn_of_mon(mtmp), bVar1 != '\0')))) &&
      (iVar2 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar2 < 3)))) {
    return '\0';
  }
  if (mtmp->data->mlet == '\r') {
    set_mimic_sym(mtmp,level);
    return '\x01';
  }
  if (level->locations[mtmp->mx][mtmp->my].typ == '\x19') {
    *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xffffff7f | 0x80;
    return '\x01';
  }
  return '\0';
}

Assistant:

static boolean restrap(struct monst *mtmp)
{
	if (mtmp->cham || mtmp->mcan || mtmp->m_ap_type ||
	   cansee(mtmp->mx, mtmp->my) || rn2(3) || (mtmp == u.ustuck) ||
	   (sensemon(mtmp) && distu(mtmp->mx, mtmp->my) <= 2))
		return FALSE;

	if (mtmp->data->mlet == S_MIMIC) {
		set_mimic_sym(mtmp, level);
		return TRUE;
	} else
	    if (level->locations[mtmp->mx][mtmp->my].typ == ROOM)  {
		mtmp->mundetected = 1;
		return TRUE;
	    }

	return FALSE;
}